

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O1

void __thiscall duckdb::WriteParquetDecimal(duckdb *this,hugeint_t input,data_ptr_t result)

{
  char cVar1;
  byte bVar7;
  byte bVar11;
  char cVar13;
  byte bVar15;
  byte bVar19;
  short sVar21;
  ushort uVar22;
  ushort uVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  bool bVar29;
  byte *pbVar30;
  uint uVar31;
  undefined1 auVar32 [14];
  undefined1 auVar33 [14];
  uint uVar34;
  ulong uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  undefined1 auVar41 [14];
  undefined1 auVar42 [14];
  undefined1 auVar43 [16];
  ulong uVar45;
  ulong uVar46;
  undefined1 auVar44 [16];
  short sVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  uint uVar51;
  short sVar52;
  ulong uVar53;
  ulong uVar54;
  hugeint_t hVar55;
  hugeint_t local_68;
  hugeint_t local_50;
  hugeint_t local_40;
  hugeint_t local_30;
  byte bVar2;
  char cVar3;
  byte bVar4;
  char cVar5;
  char cVar6;
  byte bVar8;
  char cVar9;
  char cVar10;
  byte bVar12;
  char cVar14;
  byte bVar16;
  char cVar17;
  char cVar18;
  byte bVar20;
  
  pbVar30 = (byte *)input.upper;
  local_68.upper = input.lower;
  local_68.lower = (uint64_t)this;
  hugeint_t::hugeint_t(&local_50,0);
  bVar29 = hugeint_t::operator>=(&local_68,&local_50);
  if (bVar29) {
    uVar31 = local_68.upper._4_4_;
    uVar35 = local_68.lower;
    uVar34 = (uint)DAT_013cf980;
    uVar36 = DAT_013cf980._4_4_;
    uVar40 = (ulong)DAT_013cf980;
    uVar37 = DAT_013cf980._8_4_;
    uVar38 = local_68.upper._1_4_ & uVar34;
    uVar39 = uVar31 >> 8 & uVar36;
    uVar48 = local_68.upper._3_4_ & uVar34;
    uVar49 = uVar31 >> 0x18 & uVar36;
    uVar50 = local_68.upper._2_4_ & uVar37;
    uVar51 = (uint)local_68.upper._6_2_ & DAT_013cf980._12_4_;
    sVar21 = (short)uVar48;
    cVar1 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar48 - (0xff < sVar21);
    sVar21 = (short)(uVar48 >> 0x10);
    sVar47 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar48 >> 0x10) - (0xff < sVar21),
                      cVar1);
    uVar22 = (ushort)uVar49;
    bVar2 = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar49 - (0xff < uVar22);
    sVar21 = (short)uVar50;
    cVar3 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar50 - (0xff < sVar21);
    sVar21 = (short)(uVar50 >> 0x10);
    sVar24 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar50 >> 0x10) - (0xff < sVar21),
                      cVar3);
    sVar21 = (short)uVar51;
    bVar4 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar51 - (0xff < sVar21);
    sVar21 = (short)uVar38;
    cVar5 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar38 - (0xff < sVar21);
    sVar21 = (short)(uVar38 >> 0x10);
    sVar25 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar38 >> 0x10) - (0xff < sVar21),
                      cVar5);
    sVar21 = (short)uVar39;
    cVar6 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar39 - (0xff < sVar21);
    uVar23 = (ushort)(uVar39 >> 0x10);
    uVar38 = uVar31 >> 8 & uVar34;
    uVar48 = uVar31 & uVar37;
    uVar31 = uVar31 >> 0x18 & uVar34;
    uVar37 = local_68.upper._6_2_ & uVar37;
    uVar22 = (ushort)uVar31;
    bVar7 = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar31 - (0xff < uVar22);
    sVar21 = (short)uVar37;
    bVar8 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar37 - (0xff < sVar21);
    sVar21 = (short)uVar38;
    cVar9 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar38 - (0xff < sVar21);
    uVar22 = (ushort)(uVar38 >> 0x10);
    uVar22 = CONCAT11((uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar38 >> 0x10) - (0xff < uVar22),
                      cVar9);
    auVar32._0_12_ = ZEXT212(uVar22) << 0x40;
    sVar21 = (short)uVar48;
    cVar10 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar48 - (0xff < sVar21);
    auVar32[0xc] = cVar10;
    sVar21 = (short)(uVar48 >> 0x10);
    auVar32[0xd] = (0 < sVar21) * (sVar21 < 0x100) * (char)(uVar48 >> 0x10) - (0xff < sVar21);
    bVar11 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
    bVar12 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    bVar7 = (0 < (short)uVar22) * ((short)uVar22 < 0x100) * cVar9 - (0xff < (short)uVar22);
    sVar21 = auVar32._12_2_;
    bVar8 = (0 < sVar21) * (sVar21 < 0x100) * cVar10 - (0xff < sVar21);
    cVar9 = (0 < sVar47) * (sVar47 < 0x100) * cVar1 - (0xff < sVar47);
    sVar26 = CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),cVar9);
    cVar3 = (0 < sVar24) * (sVar24 < 0x100) * cVar3 - (0xff < sVar24);
    uVar27 = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),CONCAT12(cVar3,sVar26)
                     );
    cVar1 = (0 < sVar25) * (sVar25 < 0x100) * cVar5 - (0xff < sVar25);
    sVar24 = (short)(CONCAT13((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar39 >> 0x10) -
                              (0xff < uVar23),CONCAT12(cVar6,sVar25)) >> 0x10);
    auVar43._8_4_ = (int)local_68.lower;
    auVar43._0_8_ = uVar35;
    auVar43._12_4_ = local_68.lower._4_4_;
    uVar45 = auVar43._8_8_;
    uVar34 = local_68.lower._1_4_ & uVar34;
    uVar36 = local_68.lower._4_4_ >> 8 & uVar36;
    uVar53 = uVar35 >> 0x18 & uVar40;
    uVar46 = DAT_013cf980._8_8_;
    uVar54 = uVar45 >> 0x10 & uVar46;
    sVar21 = (short)uVar53;
    cVar5 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar53 - (0xff < sVar21);
    sVar21 = (short)(uVar53 >> 0x10);
    sVar52 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar53 >> 0x10) - (0xff < sVar21),
                      cVar5);
    uVar22 = (ushort)(uVar53 >> 0x20);
    bVar2 = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar53 >> 0x20) - (0xff < uVar22);
    sVar21 = (short)uVar54;
    cVar10 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar54 - (0xff < sVar21);
    sVar21 = (short)(uVar54 >> 0x10);
    sVar25 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar54 >> 0x10) - (0xff < sVar21),
                      cVar10);
    sVar21 = (short)(uVar54 >> 0x20);
    bVar4 = (0 < sVar21) * (sVar21 < 0x100) * (char)(uVar54 >> 0x20) - (0xff < sVar21);
    sVar21 = (short)uVar34;
    cVar13 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar34 - (0xff < sVar21);
    sVar21 = (short)(uVar34 >> 0x10);
    sVar47 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar34 >> 0x10) - (0xff < sVar21),
                      cVar13);
    sVar21 = (short)uVar36;
    cVar14 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar36 - (0xff < sVar21);
    uVar23 = (ushort)(uVar36 >> 0x10);
    uVar53 = uVar35 >> 0x28 & uVar40;
    uVar54 = uVar45 >> 0x20 & uVar46;
    uVar40 = uVar35 >> 0x38 & uVar40;
    uVar46 = uVar45 >> 0x30 & uVar46;
    uVar22 = (ushort)uVar40;
    bVar15 = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar40 - (0xff < uVar22);
    sVar21 = (short)uVar46;
    bVar16 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar46 - (0xff < sVar21);
    sVar21 = (short)uVar53;
    cVar17 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar53 - (0xff < sVar21);
    uVar22 = (ushort)(uVar53 >> 0x10);
    uVar22 = CONCAT11((uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar53 >> 0x10) - (0xff < uVar22),
                      cVar17);
    auVar41._0_12_ = ZEXT212(uVar22) << 0x40;
    sVar21 = (short)uVar54;
    cVar18 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar54 - (0xff < sVar21);
    auVar41[0xc] = cVar18;
    sVar21 = (short)(uVar54 >> 0x10);
    auVar41[0xd] = (0 < sVar21) * (sVar21 < 0x100) * (char)(uVar54 >> 0x10) - (0xff < sVar21);
    bVar19 = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
    bVar20 = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    bVar15 = (0 < (short)uVar22) * ((short)uVar22 < 0x100) * cVar17 - (0xff < (short)uVar22);
    sVar21 = auVar41._12_2_;
    bVar16 = (0 < sVar21) * (sVar21 < 0x100) * cVar18 - (0xff < sVar21);
    cVar17 = (0 < sVar52) * (sVar52 < 0x100) * cVar5 - (0xff < sVar52);
    sVar52 = CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),cVar17);
    cVar10 = (0 < sVar25) * (sVar25 < 0x100) * cVar10 - (0xff < sVar25);
    uVar28 = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                      CONCAT12(cVar10,sVar52));
    cVar5 = (0 < sVar47) * (sVar47 < 0x100) * cVar13 - (0xff < sVar47);
    sVar25 = (short)(CONCAT13((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar36 >> 0x10) -
                              (0xff < uVar23),CONCAT12(cVar14,sVar47)) >> 0x10);
    sVar21 = (short)((uint)uVar27 >> 0x10);
    sVar24 = (short)(CONCAT15((0 < sVar24) * (sVar24 < 0x100) * cVar6 - (0xff < sVar24),
                              CONCAT14(cVar1,uVar27)) >> 0x20);
    sVar47 = (short)((uint)uVar28 >> 0x10);
    sVar25 = (short)(CONCAT15((0 < sVar25) * (sVar25 < 0x100) * cVar14 - (0xff < sVar25),
                              CONCAT14(cVar5,uVar28)) >> 0x20);
    *pbVar30 = (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11);
    pbVar30[1] = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
    pbVar30[2] = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
    pbVar30[3] = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    pbVar30[4] = (0 < sVar26) * (sVar26 < 0x100) * cVar9 - (0xff < sVar26);
    pbVar30[5] = (0 < sVar21) * (sVar21 < 0x100) * cVar3 - (0xff < sVar21);
    pbVar30[6] = (0 < sVar24) * (sVar24 < 0x100) * cVar1 - (0xff < sVar24);
    pbVar30[7] = 0;
    pbVar30[8] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
    pbVar30[9] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
    pbVar30[10] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
    pbVar30[0xb] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    pbVar30[0xc] = (0 < sVar52) * (sVar52 < 0x100) * cVar17 - (0xff < sVar52);
    pbVar30[0xd] = (0 < sVar47) * (sVar47 < 0x100) * cVar10 - (0xff < sVar47);
    pbVar30[0xe] = (0 < sVar25) * (sVar25 < 0x100) * cVar5 - (0xff < sVar25);
    pbVar30[0xf] = 0;
  }
  else {
    local_30.lower = 0xffffffffffffffff;
    local_30.upper = 0x7fffffffffffffff;
    local_50 = hugeint_t::operator+(&local_30,&local_68);
    hugeint_t::hugeint_t(&local_40,1);
    hVar55 = hugeint_t::operator+(&local_50,&local_40);
    uVar31 = hVar55.upper._4_4_;
    uVar35 = hVar55.lower;
    uVar34 = (uint)DAT_013cf980;
    uVar36 = DAT_013cf980._4_4_;
    uVar40 = (ulong)DAT_013cf980;
    uVar37 = DAT_013cf980._8_4_;
    uVar38 = hVar55.upper._1_4_ & uVar34;
    uVar39 = uVar31 >> 8 & uVar36;
    uVar48 = hVar55.upper._3_4_ & uVar34;
    uVar49 = uVar31 >> 0x18 & uVar36;
    uVar50 = hVar55.upper._2_4_ & uVar37;
    uVar51 = (uint)hVar55.upper._6_2_ & DAT_013cf980._12_4_;
    sVar21 = (short)uVar48;
    cVar1 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar48 - (0xff < sVar21);
    sVar21 = (short)(uVar48 >> 0x10);
    sVar47 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar48 >> 0x10) - (0xff < sVar21),
                      cVar1);
    uVar22 = (ushort)uVar49;
    bVar2 = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar49 - (0xff < uVar22);
    sVar21 = (short)uVar50;
    cVar3 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar50 - (0xff < sVar21);
    sVar21 = (short)(uVar50 >> 0x10);
    sVar24 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar50 >> 0x10) - (0xff < sVar21),
                      cVar3);
    sVar21 = (short)uVar51;
    bVar4 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar51 - (0xff < sVar21);
    sVar21 = (short)uVar38;
    cVar5 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar38 - (0xff < sVar21);
    sVar21 = (short)(uVar38 >> 0x10);
    sVar25 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar38 >> 0x10) - (0xff < sVar21),
                      cVar5);
    sVar21 = (short)uVar39;
    cVar6 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar39 - (0xff < sVar21);
    uVar23 = (ushort)(uVar39 >> 0x10);
    uVar38 = uVar31 >> 8 & uVar34;
    uVar48 = uVar31 & uVar37;
    uVar31 = uVar31 >> 0x18 & uVar34;
    uVar37 = hVar55.upper._6_2_ & uVar37;
    uVar22 = (ushort)uVar31;
    bVar7 = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar31 - (0xff < uVar22);
    sVar21 = (short)uVar37;
    bVar8 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar37 - (0xff < sVar21);
    sVar21 = (short)uVar38;
    cVar9 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar38 - (0xff < sVar21);
    uVar22 = (ushort)(uVar38 >> 0x10);
    uVar22 = CONCAT11((uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar38 >> 0x10) - (0xff < uVar22),
                      cVar9);
    auVar33._0_12_ = ZEXT212(uVar22) << 0x40;
    sVar21 = (short)uVar48;
    cVar10 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar48 - (0xff < sVar21);
    auVar33[0xc] = cVar10;
    sVar21 = (short)(uVar48 >> 0x10);
    auVar33[0xd] = (0 < sVar21) * (sVar21 < 0x100) * (char)(uVar48 >> 0x10) - (0xff < sVar21);
    bVar11 = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
    bVar12 = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    bVar7 = (0 < (short)uVar22) * ((short)uVar22 < 0x100) * cVar9 - (0xff < (short)uVar22);
    sVar21 = auVar33._12_2_;
    bVar8 = (0 < sVar21) * (sVar21 < 0x100) * cVar10 - (0xff < sVar21);
    cVar9 = (0 < sVar47) * (sVar47 < 0x100) * cVar1 - (0xff < sVar47);
    sVar26 = CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),cVar9);
    cVar3 = (0 < sVar24) * (sVar24 < 0x100) * cVar3 - (0xff < sVar24);
    uVar27 = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),CONCAT12(cVar3,sVar26)
                     );
    cVar1 = (0 < sVar25) * (sVar25 < 0x100) * cVar5 - (0xff < sVar25);
    sVar24 = (short)(CONCAT13((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar39 >> 0x10) -
                              (0xff < uVar23),CONCAT12(cVar6,sVar25)) >> 0x10);
    auVar44._8_4_ = (int)hVar55.lower;
    auVar44._0_8_ = uVar35;
    auVar44._12_4_ = hVar55.lower._4_4_;
    uVar45 = auVar44._8_8_;
    uVar34 = hVar55.lower._1_4_ & uVar34;
    uVar36 = hVar55.lower._4_4_ >> 8 & uVar36;
    uVar53 = uVar35 >> 0x18 & uVar40;
    uVar46 = DAT_013cf980._8_8_;
    uVar54 = uVar45 >> 0x10 & uVar46;
    sVar21 = (short)uVar53;
    cVar5 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar53 - (0xff < sVar21);
    sVar21 = (short)(uVar53 >> 0x10);
    sVar52 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar53 >> 0x10) - (0xff < sVar21),
                      cVar5);
    uVar22 = (ushort)(uVar53 >> 0x20);
    bVar2 = (uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar53 >> 0x20) - (0xff < uVar22);
    sVar21 = (short)uVar54;
    cVar10 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar54 - (0xff < sVar21);
    sVar21 = (short)(uVar54 >> 0x10);
    sVar25 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar54 >> 0x10) - (0xff < sVar21),
                      cVar10);
    sVar21 = (short)(uVar54 >> 0x20);
    bVar4 = (0 < sVar21) * (sVar21 < 0x100) * (char)(uVar54 >> 0x20) - (0xff < sVar21);
    sVar21 = (short)uVar34;
    cVar13 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar34 - (0xff < sVar21);
    sVar21 = (short)(uVar34 >> 0x10);
    sVar47 = CONCAT11((0 < sVar21) * (sVar21 < 0x100) * (char)(uVar34 >> 0x10) - (0xff < sVar21),
                      cVar13);
    sVar21 = (short)uVar36;
    cVar14 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar36 - (0xff < sVar21);
    uVar23 = (ushort)(uVar36 >> 0x10);
    uVar53 = uVar35 >> 0x28 & uVar40;
    uVar54 = uVar45 >> 0x20 & uVar46;
    uVar40 = uVar35 >> 0x38 & uVar40;
    uVar46 = uVar45 >> 0x30 & uVar46;
    uVar22 = (ushort)uVar40;
    bVar15 = (uVar22 != 0) * (uVar22 < 0x100) * (char)uVar40 - (0xff < uVar22);
    sVar21 = (short)uVar46;
    bVar16 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar46 - (0xff < sVar21);
    sVar21 = (short)uVar53;
    cVar17 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar53 - (0xff < sVar21);
    uVar22 = (ushort)(uVar53 >> 0x10);
    uVar22 = CONCAT11((uVar22 != 0) * (uVar22 < 0x100) * (char)(uVar53 >> 0x10) - (0xff < uVar22),
                      cVar17);
    auVar42._0_12_ = ZEXT212(uVar22) << 0x40;
    sVar21 = (short)uVar54;
    cVar18 = (0 < sVar21) * (sVar21 < 0x100) * (char)uVar54 - (0xff < sVar21);
    auVar42[0xc] = cVar18;
    sVar21 = (short)(uVar54 >> 0x10);
    auVar42[0xd] = (0 < sVar21) * (sVar21 < 0x100) * (char)(uVar54 >> 0x10) - (0xff < sVar21);
    bVar19 = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
    bVar20 = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    bVar15 = (0 < (short)uVar22) * ((short)uVar22 < 0x100) * cVar17 - (0xff < (short)uVar22);
    sVar21 = auVar42._12_2_;
    bVar16 = (0 < sVar21) * (sVar21 < 0x100) * cVar18 - (0xff < sVar21);
    cVar17 = (0 < sVar52) * (sVar52 < 0x100) * cVar5 - (0xff < sVar52);
    sVar52 = CONCAT11((bVar2 != 0) * (bVar2 < 0x100) * bVar2 - (0xff < bVar2),cVar17);
    cVar10 = (0 < sVar25) * (sVar25 < 0x100) * cVar10 - (0xff < sVar25);
    uVar28 = CONCAT13((bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4),
                      CONCAT12(cVar10,sVar52));
    cVar5 = (0 < sVar47) * (sVar47 < 0x100) * cVar13 - (0xff < sVar47);
    sVar25 = (short)(CONCAT13((uVar23 != 0) * (uVar23 < 0x100) * (char)(uVar36 >> 0x10) -
                              (0xff < uVar23),CONCAT12(cVar14,sVar47)) >> 0x10);
    sVar21 = (short)((uint)uVar27 >> 0x10);
    sVar24 = (short)(CONCAT15((0 < sVar24) * (sVar24 < 0x100) * cVar6 - (0xff < sVar24),
                              CONCAT14(cVar1,uVar27)) >> 0x20);
    sVar47 = (short)((uint)uVar28 >> 0x10);
    sVar25 = (short)(CONCAT15((0 < sVar25) * (sVar25 < 0x100) * cVar14 - (0xff < sVar25),
                              CONCAT14(cVar5,uVar28)) >> 0x20);
    *pbVar30 = (bVar11 != 0) * (bVar11 < 0x100) * bVar11 - (0xff < bVar11);
    pbVar30[1] = (bVar12 != 0) * (bVar12 < 0x100) * bVar12 - (0xff < bVar12);
    pbVar30[2] = (bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7);
    pbVar30[3] = (bVar8 != 0) * (bVar8 < 0x100) * bVar8 - (0xff < bVar8);
    pbVar30[4] = (0 < sVar26) * (sVar26 < 0x100) * cVar9 - (0xff < sVar26);
    pbVar30[5] = (0 < sVar21) * (sVar21 < 0x100) * cVar3 - (0xff < sVar21);
    pbVar30[6] = (0 < sVar24) * (sVar24 < 0x100) * cVar1 - (0xff < sVar24);
    pbVar30[7] = 0;
    pbVar30[8] = (bVar19 != 0) * (bVar19 < 0x100) * bVar19 - (0xff < bVar19);
    pbVar30[9] = (bVar20 != 0) * (bVar20 < 0x100) * bVar20 - (0xff < bVar20);
    pbVar30[10] = (bVar15 != 0) * (bVar15 < 0x100) * bVar15 - (0xff < bVar15);
    pbVar30[0xb] = (bVar16 != 0) * (bVar16 < 0x100) * bVar16 - (0xff < bVar16);
    pbVar30[0xc] = (0 < sVar52) * (sVar52 < 0x100) * cVar17 - (0xff < sVar52);
    pbVar30[0xd] = (0 < sVar47) * (sVar47 < 0x100) * cVar10 - (0xff < sVar47);
    pbVar30[0xe] = (0 < sVar25) * (sVar25 < 0x100) * cVar5 - (0xff < sVar25);
    pbVar30[0xf] = 0;
    *pbVar30 = *pbVar30 | 0x80;
  }
  return;
}

Assistant:

static void WriteParquetDecimal(hugeint_t input, data_ptr_t result) {
	bool positive = input >= 0;
	// numbers are stored as two's complement so some muckery is required
	if (!positive) {
		input = NumericLimits<hugeint_t>::Maximum() + input + 1;
	}
	uint64_t high_bytes = uint64_t(input.upper);
	uint64_t low_bytes = input.lower;

	for (idx_t i = 0; i < sizeof(uint64_t); i++) {
		auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
		result[i] = (high_bytes >> shift_count) & 0xFF;
	}
	for (idx_t i = 0; i < sizeof(uint64_t); i++) {
		auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
		result[sizeof(uint64_t) + i] = (low_bytes >> shift_count) & 0xFF;
	}
	if (!positive) {
		result[0] |= 0x80;
	}
}